

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex
          (NearestNeighborsIndex *this,NearestNeighborsIndex *from)

{
  void *pvVar1;
  SingleKdTreeIndex *this_00;
  LinearIndex *this_01;
  SquaredEuclideanDistance *this_02;
  SingleKdTreeIndex *from_00;
  LinearIndex *from_01;
  SquaredEuclideanDistance *from_02;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NearestNeighborsIndex_004279a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
            (&(this->floatsamples_).super_RepeatedPtrFieldBase,
             &(from->floatsamples_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->numberofdimensions_ = from->numberofdimensions_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 100) {
    clear_IndexType(this);
    this->_oneof_case_[0] = 100;
    this_01 = (LinearIndex *)operator_new(0x18);
    LinearIndex::LinearIndex(this_01);
    (this->IndexType_).linearindex_ = this_01;
    if (from->_oneof_case_[0] == 100) {
      from_01 = (from->IndexType_).linearindex_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_01 = (LinearIndex *)&_LinearIndex_default_instance_;
    }
    LinearIndex::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x6e) {
    clear_IndexType(this);
    this->_oneof_case_[0] = 0x6e;
    this_00 = (SingleKdTreeIndex *)operator_new(0x18);
    SingleKdTreeIndex::SingleKdTreeIndex(this_00);
    (this->IndexType_).singlekdtreeindex_ = this_00;
    if (from->_oneof_case_[0] == 0x6e) {
      from_00 = (from->IndexType_).singlekdtreeindex_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_00 = (SingleKdTreeIndex *)&_SingleKdTreeIndex_default_instance_;
    }
    SingleKdTreeIndex::MergeFrom(this_00,from_00);
  }
  this->_oneof_case_[1] = 0;
  if (from->_oneof_case_[1] == 200) {
    this->_oneof_case_[1] = 200;
    this_02 = (SquaredEuclideanDistance *)operator_new(0x18);
    SquaredEuclideanDistance::SquaredEuclideanDistance(this_02);
    (this->DistanceFunction_).squaredeuclideandistance_ = this_02;
    if (from->_oneof_case_[1] == 200) {
      from_02 = (from->DistanceFunction_).squaredeuclideandistance_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_02 = (SquaredEuclideanDistance *)&_SquaredEuclideanDistance_default_instance_;
    }
    SquaredEuclideanDistance::MergeFrom(this_02,from_02);
  }
  return;
}

Assistant:

NearestNeighborsIndex::NearestNeighborsIndex(const NearestNeighborsIndex& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      floatsamples_(from.floatsamples_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  numberofdimensions_ = from.numberofdimensions_;
  clear_has_IndexType();
  switch (from.IndexType_case()) {
    case kLinearIndex: {
      mutable_linearindex()->::CoreML::Specification::LinearIndex::MergeFrom(from.linearindex());
      break;
    }
    case kSingleKdTreeIndex: {
      mutable_singlekdtreeindex()->::CoreML::Specification::SingleKdTreeIndex::MergeFrom(from.singlekdtreeindex());
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  clear_has_DistanceFunction();
  switch (from.DistanceFunction_case()) {
    case kSquaredEuclideanDistance: {
      mutable_squaredeuclideandistance()->::CoreML::Specification::SquaredEuclideanDistance::MergeFrom(from.squaredeuclideandistance());
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NearestNeighborsIndex)
}